

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matchit.h
# Opt level: O2

void __thiscall
matchit::impl::IdBlockBase<mathiu::impl::Set>::reset
          (IdBlockBase<mathiu::impl::Set> *this,int32_t depth)

{
  _Variadic_union<std::monostate,_mathiu::impl::Set,_mathiu::impl::Set_*,_const_mathiu::impl::Set_*>
  local_58;
  undefined8 local_28;
  
  if (depth <= this->mDepth) {
    local_58._32_8_ = 0;
    local_58._40_8_ = 0;
    local_58._16_8_ = 0;
    local_58._24_8_ = 0;
    local_58._M_rest._M_rest = (_Variadic_union<mathiu::impl::Set_*,_const_mathiu::impl::Set_*>)0x0;
    local_58._8_8_ = 0;
    local_28 = 0;
    std::__detail::__variant::
    _Move_assign_base<false,_std::monostate,_mathiu::impl::Set,_mathiu::impl::Set_*,_const_mathiu::impl::Set_*>
    ::operator=((_Move_assign_base<false,_std::monostate,_mathiu::impl::Set,_mathiu::impl::Set_*,_const_mathiu::impl::Set_*>
                 *)&this->mVariant,
                (_Move_assign_base<false,_std::monostate,_mathiu::impl::Set,_mathiu::impl::Set_*,_const_mathiu::impl::Set_*>
                 *)&local_58);
    std::__detail::__variant::
    _Variant_storage<false,_std::monostate,_mathiu::impl::Set,_mathiu::impl::Set_*,_const_mathiu::impl::Set_*>
    ::~_Variant_storage((_Variant_storage<false,_std::monostate,_mathiu::impl::Set,_mathiu::impl::Set_*,_const_mathiu::impl::Set_*>
                         *)&local_58);
    this->mDepth = depth;
  }
  return;
}

Assistant:

constexpr void reset(int32_t depth)
            {
                if (mDepth - depth >= 0)
                {
                    mVariant = {};
                    mDepth = depth;
                }
            }